

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_to_proto.c
# Opt level: O2

upb_StringView strviewdup2(upb_ToProto_Context *ctx,upb_StringView str)

{
  upb_StringView uVar1;
  
  uVar1.size = str.size;
  uVar1.data = (char *)upb_Arena_Malloc(ctx->arena,uVar1.size);
  if (uVar1.data != (char *)0x0) {
    memcpy(uVar1.data,str.data,uVar1.size);
    return uVar1;
  }
  siglongjmp((__jmp_buf_tag *)ctx->err,1);
}

Assistant:

static upb_StringView strviewdup2(upb_ToProto_Context* ctx,
                                  upb_StringView str) {
  char* p = upb_Arena_Malloc(ctx->arena, str.size);
  CHK_OOM(p);
  memcpy(p, str.data, str.size);
  return (upb_StringView){.data = p, .size = str.size};
}